

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-log.c
# Opt level: O2

void borg_prt_binary(uint32_t flags,wchar_t row,wchar_t col)

{
  wchar_t c;
  wchar_t a;
  uint uVar1;
  int iVar2;
  
  uVar1 = 1;
  for (iVar2 = 0; iVar2 != 0x20; iVar2 = iVar2 + 1) {
    if ((uVar1 & flags) == 0) {
      a = L'\x01';
      c = L'-';
    }
    else {
      a = L'\x06';
      c = L'*';
    }
    Term_putch(col + iVar2,row,a,c);
    uVar1 = uVar1 * 2;
  }
  return;
}

Assistant:

static void borg_prt_binary(uint32_t flags, int row, int col)
{
    int      i;
    uint32_t bitmask;

    /* Scan the flags */
    for (i = bitmask = 1; i <= 32; i++, bitmask *= 2) {
        /* Dump set bits */
        if (flags & bitmask) {
            Term_putch(col++, row, COLOUR_BLUE, '*');
        }

        /* Dump unset bits */
        else {
            Term_putch(col++, row, COLOUR_WHITE, '-');
        }
    }
}